

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int setup_traffic_protection(ptls_t *tls,int is_enc,char *secret_label,size_t epoch,int skip_notify)

{
  ptls_iovec_t secret;
  ptls_aead_context_t *ppVar1;
  void *in_RCX;
  char *in_RDX;
  int in_ESI;
  ptls_t *in_RDI;
  int in_R8D;
  int ret;
  st_ptls_traffic_protection_t *ctx;
  undefined4 in_stack_00000038;
  undefined4 in_stack_00000050;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *local_58;
  undefined4 in_stack_ffffffffffffffd0;
  int is_enc_00;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_ESI == 0) {
    local_58 = &in_RDI->traffic_protection;
  }
  else {
    local_58 = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)
               &(in_RDI->traffic_protection).enc;
  }
  if ((in_RDX == (char *)0x0) ||
     (local_4 = derive_secret((ptls_key_schedule_t *)in_RDI,
                              (void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX),
     local_4 == 0)) {
    is_enc_00 = (int)((ulong)in_RDX >> 0x20);
    (local_58->dec).epoch = (size_t)in_RCX;
    if (in_RDI->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
      if ((local_58->dec).aead != (ptls_aead_context_t *)0x0) {
        ptls_aead_free((ptls_aead_context_t *)0x117284);
      }
      ppVar1 = ptls_aead_new((ptls_aead_algorithm_t *)in_RDI,
                             (ptls_hash_algorithm_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             is_enc_00,in_RCX,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
      (local_58->dec).aead = ppVar1;
      if (ppVar1 == (ptls_aead_context_t *)0x0) {
        local_4 = 0x201;
      }
      else {
        (local_58->dec).seq = 0;
        ptls_is_server(in_RDI);
        ptls_iovec_init(local_58,(in_RDI->key_schedule->hashes[0].algo)->digest_size);
        secret.len._0_4_ = in_stack_00000050;
        secret.base = (uint8_t *)secret_label;
        secret.len._4_4_ = is_enc;
        log_secret((ptls_t *)epoch,(char *)CONCAT44(skip_notify,in_stack_00000038),secret);
        local_4 = 0;
      }
    }
    else if (in_R8D == 0) {
      local_4 = (*in_RDI->ctx->update_traffic_key->cb)
                          (in_RDI->ctx->update_traffic_key,in_RDI,in_ESI,(size_t)in_RCX,local_58);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int setup_traffic_protection(ptls_t *tls, int is_enc, const char *secret_label, size_t epoch, int skip_notify)
{
    static const char *log_labels[2][4] = {
        {NULL, "CLIENT_EARLY_TRAFFIC_SECRET", "CLIENT_HANDSHAKE_TRAFFIC_SECRET", "CLIENT_TRAFFIC_SECRET_0"},
        {NULL, NULL, "SERVER_HANDSHAKE_TRAFFIC_SECRET", "SERVER_TRAFFIC_SECRET_0"}};
    struct st_ptls_traffic_protection_t *ctx = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;

    if (secret_label != NULL) {
        int ret;
        if ((ret = derive_secret(tls->key_schedule, ctx->secret, secret_label)) != 0)
            return ret;
    }

    ctx->epoch = epoch;

    /* special path for applications having their own record layer */
    if (tls->ctx->update_traffic_key != NULL) {
        if (skip_notify)
            return 0;
        return tls->ctx->update_traffic_key->cb(tls->ctx->update_traffic_key, tls, is_enc, epoch, ctx->secret);
    }

    if (ctx->aead != NULL)
        ptls_aead_free(ctx->aead);
    if ((ctx->aead = ptls_aead_new(tls->cipher_suite->aead, tls->cipher_suite->hash, is_enc, ctx->secret,
                                   tls->ctx->hkdf_label_prefix__obsolete)) == NULL)
        return PTLS_ERROR_NO_MEMORY; /* TODO obtain error from ptls_aead_new */
    ctx->seq = 0;

    log_secret(tls, log_labels[ptls_is_server(tls) == is_enc][epoch],
               ptls_iovec_init(ctx->secret, tls->key_schedule->hashes[0].algo->digest_size));
    PTLS_DEBUGF("[%s] %02x%02x,%02x%02x\n", log_labels[ptls_is_server(tls)][epoch], (unsigned)ctx->secret[0],
                (unsigned)ctx->secret[1], (unsigned)ctx->aead->static_iv[0], (unsigned)ctx->aead->static_iv[1]);

    return 0;
}